

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> * __thiscall
ylt::metric::static_metric_manager<test_id_t<3ul>>::
create_metric_static<ylt::metric::basic_static_counter<long>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          (pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>
           *__return_storage_ptr__,void *this,string *name,string *help,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args)

{
  bool bVar1;
  error_category *peVar2;
  shared_ptr<ylt::metric::basic_static_counter<long>_> m;
  undefined1 auStack_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::
  make_shared<ylt::metric::basic_static_counter<long>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_48,name,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)help);
  std::__shared_ptr<ylt::metric::static_metric,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ylt::metric::basic_static_counter<long>,void>
            ((__shared_ptr<ylt::metric::static_metric,(__gnu_cxx::_Lock_policy)2> *)
             (auStack_48 + 0x10),
             (__shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2> *)
             auStack_48);
  bVar1 = static_metric_manager<test_id_t<3UL>_>::register_metric
                    ((static_metric_manager<test_id_t<3UL>_> *)this,
                     (shared_ptr<ylt::metric::static_metric> *)(auStack_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  if (bVar1) {
    peVar2 = (error_category *)std::_V2::system_category();
    (__return_storage_ptr__->first)._M_value = 0;
    (__return_storage_ptr__->first)._M_cat = peVar2;
    std::__shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&(__return_storage_ptr__->second).
                  super___shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>
                   *)auStack_48);
  }
  else {
    peVar2 = (error_category *)std::_V2::generic_category();
    (__return_storage_ptr__->first)._M_value = 0x16;
    (__return_storage_ptr__->first)._M_cat = peVar2;
    (__return_storage_ptr__->second).
    super___shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->second).
    super___shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::error_code, std::shared_ptr<T>> create_metric_static(
      const std::string& name, const std::string& help, Args&&... args) {
    auto m = std::make_shared<T>(name, help, std::forward<Args>(args)...);
    bool r = register_metric(m);
    if (!r) {
      return std::make_pair(std::make_error_code(std::errc::invalid_argument),
                            nullptr);
    }

    return std::make_pair(std::error_code{}, m);
  }